

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PolyConnectivity.cc
# Opt level: O0

void __thiscall OpenMesh::PolyConnectivity::reinsert_edge(PolyConnectivity *this,EdgeHandle _eh)

{
  bool bVar1;
  HalfedgeHandle _heh;
  HalfedgeHandle _heh_00;
  HalfedgeHandle _heh_01;
  HalfedgeHandle _heh_02;
  StatusInfo *pSVar2;
  BaseHandle local_d4;
  BaseHandle local_d0;
  BaseHandle local_cc;
  BaseHandle local_c8;
  BaseHandle local_c4;
  BaseHandle local_c0;
  BaseHandle local_bc;
  BaseHandle local_b8;
  BaseHandle local_b4;
  BaseHandle local_b0;
  BaseHandle local_ac;
  undefined1 local_a8 [8];
  FaceHalfedgeIter fh_it;
  HalfedgeHandle next_heh1;
  HalfedgeHandle next_heh0;
  HalfedgeHandle prev_heh1;
  HalfedgeHandle prev_heh0;
  BaseHandle local_40;
  BaseHandle local_3c;
  FaceHandle del_fh;
  FaceHandle rem_fh;
  HalfedgeHandle heh1;
  HalfedgeHandle heh0;
  PolyConnectivity *this_local;
  EdgeHandle _eh_local;
  
  pSVar2 = ArrayKernel::status(&this->super_ArrayKernel,_eh);
  bVar1 = Attributes::StatusInfo::deleted(pSVar2);
  if (!bVar1) {
    __assert_fail("status(_eh).deleted()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/OpenMesh/Core/Mesh/PolyConnectivity.cc"
                  ,0x3a1,"void OpenMesh::PolyConnectivity::reinsert_edge(EdgeHandle)");
  }
  pSVar2 = ArrayKernel::status(&this->super_ArrayKernel,_eh);
  Attributes::StatusInfo::set_deleted(pSVar2,false);
  _heh = ArrayKernel::halfedge_handle(&this->super_ArrayKernel,_eh,0);
  _heh_00 = ArrayKernel::halfedge_handle(&this->super_ArrayKernel,_eh,1);
  local_3c = _heh.super_BaseHandle.idx_;
  del_fh = ArrayKernel::face_handle(&this->super_ArrayKernel,_heh);
  local_40.idx_ = (int)ArrayKernel::face_handle(&this->super_ArrayKernel,_heh_00);
  bVar1 = BaseHandle::is_valid(&local_40);
  if (!bVar1) {
    std::swap<OpenMesh::FaceHandle>((FaceHandle *)&local_40,&del_fh);
  }
  pSVar2 = ArrayKernel::status(&this->super_ArrayKernel,(FaceHandle)local_40.idx_);
  bVar1 = Attributes::StatusInfo::deleted(pSVar2);
  if (bVar1) {
    pSVar2 = ArrayKernel::status(&this->super_ArrayKernel,(FaceHandle)local_40.idx_);
    Attributes::StatusInfo::set_deleted(pSVar2,false);
    prev_heh1 = ArrayKernel::prev_halfedge_handle(&this->super_ArrayKernel,_heh);
    next_heh0 = ArrayKernel::prev_halfedge_handle(&this->super_ArrayKernel,_heh_00);
    _heh_01 = ArrayKernel::next_halfedge_handle(&this->super_ArrayKernel,_heh);
    _heh_02 = ArrayKernel::next_halfedge_handle(&this->super_ArrayKernel,_heh_00);
    ArrayKernel::set_next_halfedge_handle(&this->super_ArrayKernel,prev_heh1,_heh);
    ArrayKernel::set_prev_halfedge_handle(&this->super_ArrayKernel,_heh_01,_heh);
    ArrayKernel::set_next_halfedge_handle(&this->super_ArrayKernel,next_heh0,_heh_00);
    fh_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>._20_4_ = _heh_00;
    ArrayKernel::set_prev_halfedge_handle(&this->super_ArrayKernel,_heh_02,_heh_00);
    local_ac.idx_ = local_40.idx_;
    fh_iter((FaceHalfedgeIter *)local_a8,this,(FaceHandle)local_40.idx_);
    while (bVar1 = Iterators::
                   GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::HalfedgeHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toHalfedgeHandle>
                   ::is_valid((GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::HalfedgeHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toHalfedgeHandle>
                               *)local_a8), bVar1) {
      local_b0.idx_ =
           (int)Iterators::
                GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::HalfedgeHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toHalfedgeHandle>
                ::operator*((GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::HalfedgeHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toHalfedgeHandle>
                             *)local_a8);
      local_b4.idx_ = local_40.idx_;
      ArrayKernel::set_face_handle
                (&this->super_ArrayKernel,(HalfedgeHandle)local_b0.idx_,(FaceHandle)local_40.idx_);
      Iterators::
      GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::HalfedgeHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toHalfedgeHandle>
      ::operator++((GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::HalfedgeHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toHalfedgeHandle>
                    *)local_a8);
    }
    local_c0 = del_fh.super_BaseHandle.idx_;
    local_bc.idx_ = (int)ArrayKernel::halfedge_handle(&this->super_ArrayKernel,del_fh);
    local_b8.idx_ =
         (int)ArrayKernel::face_handle(&this->super_ArrayKernel,(HalfedgeHandle)local_bc.idx_);
    bVar1 = BaseHandle::operator==(&local_b8,&local_40);
    if (bVar1) {
      local_c8 = del_fh.super_BaseHandle.idx_;
      local_c4.idx_ = (int)ArrayKernel::halfedge_handle(&this->super_ArrayKernel,del_fh);
      bVar1 = BaseHandle::operator==(&local_c4,&prev_heh1.super_BaseHandle);
      if (bVar1) {
        local_cc = del_fh.super_BaseHandle.idx_;
        local_d0 = _heh_00.super_BaseHandle.idx_;
        ArrayKernel::set_halfedge_handle(&this->super_ArrayKernel,del_fh,_heh_00);
      }
      else {
        local_d4.idx_ = (int)ArrayKernel::halfedge_handle(&this->super_ArrayKernel,del_fh);
        bVar1 = BaseHandle::operator==(&local_d4,&next_heh0.super_BaseHandle);
        if (!bVar1) {
          __assert_fail("halfedge_handle(rem_fh) == prev_heh1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/OpenMesh/Core/Mesh/PolyConnectivity.cc"
                        ,0x3c8,"void OpenMesh::PolyConnectivity::reinsert_edge(EdgeHandle)");
        }
        ArrayKernel::set_halfedge_handle(&this->super_ArrayKernel,del_fh,_heh);
      }
    }
    return;
  }
  __assert_fail("status(del_fh).deleted()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/OpenMesh/Core/Mesh/PolyConnectivity.cc"
                ,0x3ab,"void OpenMesh::PolyConnectivity::reinsert_edge(EdgeHandle)");
}

Assistant:

void PolyConnectivity::reinsert_edge(EdgeHandle _eh)
{
  //this does not work without prev_halfedge_handle
  assert_compile(sizeof(Halfedge) == sizeof(Halfedge_with_prev));
  //shoudl be deleted  
  assert(status(_eh).deleted());
  status(_eh).set_deleted(false);  
  
  HalfedgeHandle heh0 = halfedge_handle(_eh, 0);
  HalfedgeHandle heh1 = halfedge_handle(_eh, 1);
  FaceHandle rem_fh = face_handle(heh0), del_fh = face_handle(heh1);
  if (!del_fh.is_valid())
  {//boundary case - we must delete the rem_fh
    std::swap(del_fh, rem_fh);
  }
  assert(status(del_fh).deleted());
  status(del_fh).set_deleted(false); 
  
  //restore halfedge relations
  HalfedgeHandle prev_heh0 = prev_halfedge_handle(heh0);
  HalfedgeHandle prev_heh1 = prev_halfedge_handle(heh1);

  HalfedgeHandle next_heh0 = next_halfedge_handle(heh0);
  HalfedgeHandle next_heh1 = next_halfedge_handle(heh1);
  
  set_next_halfedge_handle(prev_heh0, heh0);
  set_prev_halfedge_handle(next_heh0, heh0);
  
  set_next_halfedge_handle(prev_heh1, heh1);
  set_prev_halfedge_handle(next_heh1, heh1);
  
  for (FaceHalfedgeIter fh_it = fh_iter(del_fh); fh_it.is_valid(); ++fh_it)
  {//reassign halfedges to del_fh  
    set_face_handle(*fh_it, del_fh);
  }
   
  if (face_handle(halfedge_handle(rem_fh)) == del_fh)
  {//correct the halfedge handle of rem_fh
    if (halfedge_handle(rem_fh) == prev_heh0)
    {//rem_fh is the face at heh1
      set_halfedge_handle(rem_fh, heh1);
    }
    else
    {//rem_fh is the face at heh0
      assert(halfedge_handle(rem_fh) == prev_heh1);
      set_halfedge_handle(rem_fh, heh0);
    }
  }
}